

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O0

void __thiscall
randomx::AssemblyGeneratorX86::genAddressRegDst
          (AssemblyGeneratorX86 *this,Instruction *instr,int maskAlign)

{
  uint32_t uVar1;
  int iVar2;
  ostream *poVar3;
  void *pvVar4;
  int in_EDX;
  Instruction *in_RSI;
  long in_RDI;
  int mask;
  uint local_18;
  
  poVar3 = std::operator<<((ostream *)(in_RDI + 0x10),"\tlea eax, [");
  poVar3 = std::operator<<(poVar3,*(char **)(regR32 + (ulong)in_RSI->dst * 8));
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::showpos);
  uVar1 = Instruction::getImm32((Instruction *)0x10d337);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,uVar1);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::noshowpos);
  poVar3 = std::operator<<(poVar3,"]");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  iVar2 = Instruction::getModCond(in_RSI);
  if (iVar2 < 0xe) {
    iVar2 = Instruction::getModMem(in_RSI);
    local_18 = 0x3fff8;
    if (iVar2 != 0) {
      local_18 = 0x3ff8;
    }
  }
  else {
    local_18 = 0x1ffff8;
  }
  poVar3 = std::operator<<((ostream *)(in_RDI + 0x10),"\tand eax");
  poVar3 = std::operator<<(poVar3,", ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,local_18 & -in_EDX);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void AssemblyGeneratorX86::genAddressRegDst(Instruction& instr, int maskAlign = 8) {
		asmCode << "\tlea eax, [" << regR32[instr.dst] << std::showpos << (int32_t)instr.getImm32() << std::noshowpos << "]" << std::endl;
		int mask;
		if (instr.getModCond() < StoreL3Condition) {
			mask = instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask;
		}
		else {
			mask = ScratchpadL3Mask;
		}
		asmCode << "\tand eax" << ", " << (mask & (-maskAlign)) << std::endl;
	}